

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::TestinitiatorFixtureQueuedLogonMessages::RunImpl
          (TestinitiatorFixtureQueuedLogonMessages *this)

{
  TestDetails *details;
  initiatorFixtureQueuedLogonMessagesHelper fixtureHelper;
  initiatorFixtureQueuedLogonMessagesHelper local_660;
  
  details = &(this->super_Test).m_details;
  sessionFixture::sessionFixture((sessionFixture *)&local_660,1);
  local_660.super_initiatorFixture.super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionFixture_0032c208;
  local_660.super_initiatorFixture.super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application =
       (Application)&PTR__initiatorFixtureQueuedLogonMessagesHelper_0032c260;
  local_660.m_details = details;
  UnitTest::ExecuteTest<SuiteSessionTests::initiatorFixtureQueuedLogonMessagesHelper>
            (&local_660,details);
  sessionFixture::~sessionFixture((sessionFixture *)&local_660);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, QueuedLogonMessages)
{
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  createSession(1, 0, 31);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 2 );
  object->next(receivedLogon, UtcTimeStamp(), true);

  for( int i = 3; i <= 6; ++i )
  {
      object->next( createNewOrderSingle( "ISLD", "TW", i), UtcTimeStamp() );
  }
  CHECK_EQUAL( 1, object->getExpectedTargetNum() );
  CHECK_EQUAL( 1, toResendRequest );

  object->next( createNewOrderSingle( "ISLD", "TW", 1), UtcTimeStamp() );
  CHECK_EQUAL( 1, toResendRequest );
  CHECK_EQUAL( 7, object->getExpectedTargetNum() );
}